

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

LogHelper * util::operator<<(LogHelper *h,char (*t) [1])

{
  ostream *poVar1;
  size_t sVar2;
  
  if (h->clearline == true) {
    h->clearline = false;
    operator<<(h,clearline);
  }
  poVar1 = h->screen;
  sVar2 = strlen(*t);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,*t,sVar2);
  poVar1 = h->file;
  if ((poVar1 != (ostream *)0x0) && (h->statusmsg == false)) {
    sVar2 = strlen(*t);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,*t,sVar2);
  }
  return h;
}

Assistant:

LogHelper& operator<<(LogHelper& h, const T& t)
{
    if (h.clearline)
    {
        h.clearline = false;
        h << ttycmd::clearline;
    }

    *h.screen << t;
    if (h.file && !h.statusmsg) *h.file << t;
    return h;
}